

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdin(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  char *pcVar6;
  uv_timer_t *puVar7;
  int extraout_EDX;
  uv_process_t *puVar8;
  uv_timer_t *puVar9;
  code *pcVar10;
  char buffer [23];
  uv_buf_t buf;
  uv_stdio_container_t stdio [2];
  uv_pipe_t in;
  uv_pipe_t out;
  uv_write_t write_req;
  int iStack_5fc;
  undefined1 auStack_5f8 [16];
  uv_stdio_container_t uStack_5e8;
  undefined4 uStack_5d8;
  undefined4 uStack_5d0;
  undefined4 uStack_5c8;
  undefined4 uStack_5c0;
  undefined4 uStack_5b8;
  int iStack_5b0;
  code *pcStack_5a8;
  undefined1 auStack_5a0 [240];
  code *pcStack_4b0;
  uv_stdio_container_t uStack_4a8;
  undefined4 uStack_498;
  undefined4 uStack_488;
  undefined4 uStack_478;
  undefined1 *puStack_470;
  undefined1 auStack_460 [264];
  undefined1 *puStack_358;
  anon_union_8_2_26168aa3_for_data aStack_350;
  char local_338 [32];
  undefined1 *local_318;
  undefined8 local_310;
  uv_stdio_container_t local_308;
  undefined4 local_2f8;
  undefined1 *local_2f0;
  undefined1 local_2e8 [264];
  undefined1 local_1e0 [264];
  undefined1 local_d8 [192];
  
  pcVar6 = local_338;
  builtin_strncpy(local_338,"hello-from-spawn_stdin",0x17);
  init_process_options("spawn_helper3",exit_cb);
  uVar3 = uv_default_loop();
  puVar5 = local_1e0;
  uv_pipe_init(uVar3,puVar5,0);
  uVar3 = uv_default_loop();
  uv_pipe_init(uVar3,(uv_stream_t *)local_2e8,0);
  options.stdio = &local_308;
  local_308.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_2f8 = 0x21;
  options.stdio_count = 2;
  local_308.data.stream = (uv_stream_t *)local_2e8;
  local_2f0 = puVar5;
  puVar4 = (undefined1 *)uv_default_loop();
  iVar2 = 0x31aa10;
  iVar1 = uv_spawn(puVar4,&process,&options);
  if (iVar1 == 0) {
    local_310 = 0x17;
    puVar4 = local_d8;
    iVar2 = (int)local_2e8;
    local_318 = local_338;
    iVar1 = uv_write();
    if (iVar1 != 0) goto LAB_0016d213;
    iVar2 = 0x16c6a5;
    puVar4 = local_1e0;
    iVar1 = uv_read_start(puVar4,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016d218;
    puVar4 = (undefined1 *)uv_default_loop();
    iVar2 = 0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016d21d;
    if (exit_cb_called != 1) goto LAB_0016d222;
    if (close_cb_called != 3) goto LAB_0016d227;
    iVar2 = 0x31aaa0;
    iVar1 = strcmp(local_338,output);
    if (iVar1 != 0) goto LAB_0016d22c;
    puVar5 = (undefined1 *)uv_default_loop();
    uv_walk(puVar5,close_walk_cb,0);
    iVar2 = 0;
    uv_run(puVar5);
    pcVar6 = (char *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_stdin_cold_1();
LAB_0016d213:
    run_test_spawn_stdin_cold_2();
LAB_0016d218:
    run_test_spawn_stdin_cold_3();
LAB_0016d21d:
    run_test_spawn_stdin_cold_4();
LAB_0016d222:
    run_test_spawn_stdin_cold_5();
LAB_0016d227:
    pcVar6 = puVar4;
    run_test_spawn_stdin_cold_6();
LAB_0016d22c:
    run_test_spawn_stdin_cold_7();
  }
  run_test_spawn_stdin_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_close(*(undefined8 *)(pcVar6 + 0x50),close_cb);
    return iVar2;
  }
  write_cb_cold_1();
  pcStack_4b0 = (code *)0x16d26e;
  puStack_358 = puVar5;
  aStack_350.stream = (uv_stream_t *)local_2e8;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_4b0 = (code *)0x16d273;
  uVar3 = uv_default_loop();
  puVar5 = auStack_460;
  pcStack_4b0 = (code *)0x16d287;
  uv_pipe_init(uVar3,puVar5,0);
  uStack_4a8.flags = UV_IGNORE;
  uStack_498 = 0;
  uStack_488 = 0;
  uStack_478 = 0x21;
  options.stdio_count = 4;
  pcStack_4b0 = (code *)0x16d2ba;
  options.stdio = &uStack_4a8;
  puStack_470 = puVar5;
  uVar3 = uv_default_loop();
  pcStack_4b0 = (code *)0x16d2cc;
  iVar2 = uv_spawn(uVar3,&process,&options);
  if (iVar2 == 0) {
    pcStack_4b0 = (code *)0x16d2ec;
    iVar2 = uv_read_start(auStack_460,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_0016d3a8;
    pcStack_4b0 = (code *)0x16d2f9;
    uVar3 = uv_default_loop();
    pcStack_4b0 = (code *)0x16d303;
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0016d3ad;
    if (exit_cb_called != 1) goto LAB_0016d3b2;
    if (close_cb_called != 2) goto LAB_0016d3b7;
    pcStack_4b0 = (code *)0x16d33a;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT71(output._8_7_,output[7]) != 0xa216f69647473 ||
        CONCAT17(output[7],output._0_7_) != 0x7320687472756f66) goto LAB_0016d3bc;
    pcStack_4b0 = (code *)0x16d366;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_4b0 = (code *)0x16d37a;
    uv_walk(puVar5,close_walk_cb,0);
    pcStack_4b0 = (code *)0x16d384;
    uv_run(puVar5,0);
    pcStack_4b0 = (code *)0x16d389;
    uVar3 = uv_default_loop();
    pcStack_4b0 = (code *)0x16d391;
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_4b0 = (code *)0x16d3a8;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_0016d3a8:
    pcStack_4b0 = (code *)0x16d3ad;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_0016d3ad:
    pcStack_4b0 = (code *)0x16d3b2;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_0016d3b2:
    pcStack_4b0 = (code *)0x16d3b7;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_0016d3b7:
    pcStack_4b0 = (code *)0x16d3bc;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_0016d3bc:
    pcStack_4b0 = (code *)0x16d3c1;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_4b0 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  pcStack_5a8 = (code *)0x16d3d2;
  uVar3 = uv_default_loop();
  pcStack_5a8 = (code *)0x16d3dd;
  iVar2 = uv_tcp_init(uVar3,auStack_5a0);
  if (iVar2 == 0) {
    pcStack_5a8 = (code *)0x16d3ee;
    iVar2 = uv_tcp_open(auStack_5a0,3);
    if (iVar2 != 0) goto LAB_0016d417;
    pcStack_5a8 = (code *)0x16d401;
    iVar2 = uv_listen(auStack_5a0,0x1000,0);
    if (iVar2 == 0) {
      return 1;
    }
  }
  else {
    pcStack_5a8 = (code *)0x16d417;
    spawn_tcp_server_helper_cold_1();
LAB_0016d417:
    pcStack_5a8 = (code *)0x16d41c;
    spawn_tcp_server_helper_cold_2();
  }
  pcStack_5a8 = run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  pcStack_5a8 = (code *)puVar5;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_5f8);
  if (iVar2 == 0) {
    iStack_5fc = -1;
    uVar3 = uv_default_loop();
    iVar2 = uv_tcp_init_ex(uVar3,&tcp_server,2);
    if (iVar2 != 0) goto LAB_0016d582;
    iVar2 = uv_tcp_bind(&tcp_server,auStack_5f8,0);
    if (iVar2 != 0) goto LAB_0016d587;
    iVar2 = uv_fileno(&tcp_server,&iStack_5fc);
    if (iVar2 != 0) goto LAB_0016d58c;
    if (iStack_5fc < 1) goto LAB_0016d591;
    options.stdio = &uStack_5e8;
    uStack_5e8.flags = UV_INHERIT_FD;
    uStack_5e8.data.fd = 0;
    uStack_5d8 = 2;
    uStack_5d0 = 1;
    uStack_5c8 = 2;
    uStack_5c0 = 2;
    uStack_5b8 = 2;
    iStack_5b0 = iStack_5fc;
    options.stdio_count = 4;
    uVar3 = uv_default_loop();
    iVar2 = uv_spawn(uVar3,&process,&options);
    if (iVar2 != 0) goto LAB_0016d596;
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0016d59b;
    if (exit_cb_called != 1) goto LAB_0016d5a0;
    if (close_cb_called != 1) goto LAB_0016d5a5;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    uVar3 = uv_default_loop();
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0016d582:
    run_test_spawn_tcp_server_cold_2();
LAB_0016d587:
    run_test_spawn_tcp_server_cold_3();
LAB_0016d58c:
    run_test_spawn_tcp_server_cold_4();
LAB_0016d591:
    run_test_spawn_tcp_server_cold_5();
LAB_0016d596:
    run_test_spawn_tcp_server_cold_6();
LAB_0016d59b:
    run_test_spawn_tcp_server_cold_7();
LAB_0016d5a0:
    run_test_spawn_tcp_server_cold_8();
LAB_0016d5a5:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar3 = uv_default_loop();
  iVar2 = uv_spawn(uVar3,&process,&options);
  if (iVar2 == 0) {
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0016d65c;
    if (exit_cb_called != 1) goto LAB_0016d661;
    if (close_cb_called != 1) goto LAB_0016d666;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    uVar3 = uv_default_loop();
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016d65c:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016d661:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016d666:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  puVar7 = (uv_timer_t *)uv_default_loop();
  puVar8 = &process;
  iVar2 = uv_spawn(puVar7,&process,&options);
  if (iVar2 == 0) {
    puVar7 = (uv_timer_t *)uv_default_loop();
    puVar9 = &timer;
    iVar2 = uv_timer_init();
    pcVar10 = (code *)puVar9;
    if (iVar2 != 0) goto LAB_0016d743;
    puVar7 = &timer;
    pcVar10 = timer_cb;
    iVar2 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar2 != 0) goto LAB_0016d748;
    puVar7 = (uv_timer_t *)uv_default_loop();
    pcVar10 = (code *)0x0;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_0016d74d;
    if (exit_cb_called != 1) goto LAB_0016d752;
    if (close_cb_called != 2) goto LAB_0016d757;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    pcVar10 = (code *)0x0;
    uv_run(uVar3);
    puVar7 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar10 = (code *)puVar8;
LAB_0016d743:
    run_test_spawn_and_kill_cold_2();
LAB_0016d748:
    run_test_spawn_and_kill_cold_3();
LAB_0016d74d:
    run_test_spawn_and_kill_cold_4();
LAB_0016d752:
    run_test_spawn_and_kill_cold_5();
LAB_0016d757:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar6 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar10 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close(puVar7,close_cb);
      pcVar6 = (char *)(ulong)*(uint *)puVar7->heap_node;
      iVar2 = uv_kill(pcVar6,0);
      if (iVar2 == -3) {
        return iVar2;
      }
      goto LAB_0016d7b6;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016d7b6:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar2 = uv_close(pcVar6,close_cb);
  return iVar2;
}

Assistant:

TEST_IMPL(spawn_stdin) {
  int r;
  uv_pipe_t out;
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  char buffer[] = "hello-from-spawn_stdin";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*)&in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*)&out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  buf.base = buffer;
  buf.len = sizeof(buffer);
  r = uv_write(&write_req, (uv_stream_t*)&in, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3); /* Once for process twice for the pipe. */
  ASSERT(strcmp(buffer, output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}